

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

int __thiscall
gl3cts::TransformFeedbackOverflowQueryStateUpdate::init
          (TransformFeedbackOverflowQueryStateUpdate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  
  TransformFeedbackOverflowQueryBaseTest::init((TransformFeedbackOverflowQueryBaseTest *)this,ctx);
  iVar1 = (*((this->super_TransformFeedbackOverflowQueryContextStateBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))(1,&this->m_overflow_query);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))(1,&this->m_stream_overflow_query);
  return iVar1;
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryContextStateBase::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genQueries(1, &m_overflow_query);
		gl.genQueries(1, &m_stream_overflow_query);
	}